

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

bool __thiscall
cppcms::http::request::parse_form_urlencoded(request *this,char *begin,char *end,form_type *out)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  char *in_RDX;
  char *in_RSI;
  string value;
  string name;
  char *name_end;
  char *e;
  char *p;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_iterator>
  in_stack_ffffffffffffff08;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_iterator>
  in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string local_90 [32];
  string local_70 [39];
  undefined1 local_49;
  char *local_48;
  undefined1 local_39;
  char *local_38;
  char *local_30;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  char *local_20;
  
  local_30 = in_RSI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  while( true ) {
    if (local_20 <= local_30) {
      return true;
    }
    local_39 = 0x26;
    local_38 = std::find<char_const*,char>
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          in_stack_ffffffffffffff20);
    local_49 = 0x3d;
    local_48 = std::find<char_const*,char>
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          in_stack_ffffffffffffff20);
    if ((local_48 == local_38) || (local_48 == local_30)) break;
    util::urldecode_abi_cxx11_(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    util::urldecode_abi_cxx11_(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    this_00 = local_28;
    std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18._M_node,&local_28->first);
    in_stack_ffffffffffffff08 =
         std::
         multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                   (in_stack_ffffffffffffff08._M_node,
                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x391009);
    in_stack_ffffffffffffff18 = in_stack_ffffffffffffff08;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(this_00);
    local_30 = local_38 + 1;
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
  }
  return false;
}

Assistant:

bool request::parse_form_urlencoded(char const *begin,char const *end,form_type &out)
{
	char const *p;
	for(p=begin;p<end;) {
		char const *e=std::find(p,end,'&');
		char const *name_end=std::find(p,e,'=');
		if(name_end==e || name_end==p)
			return false;
		std::string name=util::urldecode(p,name_end);
		std::string value=util::urldecode(name_end+1,e);
		out.insert(std::make_pair(name,value));
		p=e+1;
	}
	return true;
}